

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

intptr_t fio_socket(char *address,char *port,uint8_t server)

{
  undefined1 *puVar1;
  undefined1 uVar2;
  addrinfo *paVar3;
  bool bVar4;
  fio_data_s *pfVar5;
  int iVar6;
  uint fd;
  int iVar7;
  int64_t iVar8;
  int *piVar9;
  size_t sVar10;
  intptr_t iVar11;
  undefined7 in_register_00000011;
  addrinfo **ppaVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  ulong uStack_e0;
  int optval;
  addrinfo *addrinfo;
  uint local_bc;
  char *local_b8;
  void *local_b0;
  char *pos;
  char acStack_a0 [112];
  
  uVar14 = CONCAT71(in_register_00000011,server) & 0xffffffff;
  if (port == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    pos._0_2_ = SUB82(port,0);
    pos._2_2_ = (undefined2)((ulong)port >> 0x10);
    pos._4_4_ = (undefined4)((ulong)port >> 0x20);
    iVar8 = fio_atol(&pos);
    if (*(char *)CONCAT44(pos._4_4_,CONCAT22(pos._2_2_,pos._0_2_)) != '\0') {
      if (1 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("ERROR: (fio_socket) port %s is not a number.",port);
      }
      goto LAB_00106b59;
    }
    pcVar13 = port;
    if (((iVar8 < 1) && (pcVar13 = (char *)0x0, iVar8 < -1)) && (2 < FIO_LOG_LEVEL)) {
      FIO_LOG2STDERR("WARNING: (fio_socket) negative port number %s is ignored.",port);
      pcVar13 = (char *)0x0;
    }
  }
  if (address != (char *)0x0 || pcVar13 != (char *)0x0) {
    piVar9 = __errno_location();
    local_bc = (uint)CONCAT71(in_register_00000011,server);
    local_b8 = address;
    if (pcVar13 == (char *)0x0) {
      do {
        pcVar13 = local_b8;
        *piVar9 = 0;
        acStack_a0[0x5a] = '\0';
        acStack_a0[0x5b] = '\0';
        acStack_a0[0x5c] = '\0';
        acStack_a0[0x5d] = '\0';
        acStack_a0[0x5e] = '\0';
        acStack_a0[0x5f] = '\0';
        acStack_a0[0x60] = '\0';
        acStack_a0[0x61] = '\0';
        acStack_a0[0x62] = '\0';
        acStack_a0[99] = '\0';
        acStack_a0[100] = '\0';
        acStack_a0[0x65] = '\0';
        acStack_a0[0x4a] = '\0';
        acStack_a0[0x4b] = '\0';
        acStack_a0[0x4c] = '\0';
        acStack_a0[0x4d] = '\0';
        acStack_a0[0x4e] = '\0';
        acStack_a0[0x4f] = '\0';
        acStack_a0[0x50] = '\0';
        acStack_a0[0x51] = '\0';
        acStack_a0[0x52] = '\0';
        acStack_a0[0x53] = '\0';
        acStack_a0[0x54] = '\0';
        acStack_a0[0x55] = '\0';
        acStack_a0[0x56] = '\0';
        acStack_a0[0x57] = '\0';
        acStack_a0[0x58] = '\0';
        acStack_a0[0x59] = '\0';
        acStack_a0[0x3a] = '\0';
        acStack_a0[0x3b] = '\0';
        acStack_a0[0x3c] = '\0';
        acStack_a0[0x3d] = '\0';
        acStack_a0[0x3e] = '\0';
        acStack_a0[0x3f] = '\0';
        acStack_a0[0x40] = '\0';
        acStack_a0[0x41] = '\0';
        acStack_a0[0x42] = '\0';
        acStack_a0[0x43] = '\0';
        acStack_a0[0x44] = '\0';
        acStack_a0[0x45] = '\0';
        acStack_a0[0x46] = '\0';
        acStack_a0[0x47] = '\0';
        acStack_a0[0x48] = '\0';
        acStack_a0[0x49] = '\0';
        acStack_a0[0x2a] = '\0';
        acStack_a0[0x2b] = '\0';
        acStack_a0[0x2c] = '\0';
        acStack_a0[0x2d] = '\0';
        acStack_a0[0x2e] = '\0';
        acStack_a0[0x2f] = '\0';
        acStack_a0[0x30] = '\0';
        acStack_a0[0x31] = '\0';
        acStack_a0[0x32] = '\0';
        acStack_a0[0x33] = '\0';
        acStack_a0[0x34] = '\0';
        acStack_a0[0x35] = '\0';
        acStack_a0[0x36] = '\0';
        acStack_a0[0x37] = '\0';
        acStack_a0[0x38] = '\0';
        acStack_a0[0x39] = '\0';
        acStack_a0[0x1a] = '\0';
        acStack_a0[0x1b] = '\0';
        acStack_a0[0x1c] = '\0';
        acStack_a0[0x1d] = '\0';
        acStack_a0[0x1e] = '\0';
        acStack_a0[0x1f] = '\0';
        acStack_a0[0x20] = '\0';
        acStack_a0[0x21] = '\0';
        acStack_a0[0x22] = '\0';
        acStack_a0[0x23] = '\0';
        acStack_a0[0x24] = '\0';
        acStack_a0[0x25] = '\0';
        acStack_a0[0x26] = '\0';
        acStack_a0[0x27] = '\0';
        acStack_a0[0x28] = '\0';
        acStack_a0[0x29] = '\0';
        acStack_a0._10_6_ = 0;
        acStack_a0[0x10] = '\0';
        acStack_a0[0x11] = '\0';
        acStack_a0[0x12] = '\0';
        acStack_a0[0x13] = '\0';
        acStack_a0[0x14] = '\0';
        acStack_a0[0x15] = '\0';
        acStack_a0[0x16] = '\0';
        acStack_a0[0x17] = '\0';
        acStack_a0[0x18] = '\0';
        acStack_a0[0x19] = '\0';
        pos._2_2_ = 0;
        pos._4_4_ = 0;
        acStack_a0[0] = '\0';
        acStack_a0[1] = '\0';
        acStack_a0[2] = '\0';
        acStack_a0[3] = '\0';
        acStack_a0[4] = '\0';
        acStack_a0[5] = '\0';
        acStack_a0[6] = '\0';
        acStack_a0[7] = '\0';
        acStack_a0[8] = '\0';
        acStack_a0[9] = '\0';
        sVar10 = strlen(local_b8);
        if (sVar10 < 0x6c) {
          pos._0_2_ = 1;
          memcpy((char *)((long)&pos + 2),pcVar13,sVar10 + 1);
          iVar6 = socket(1,1,0);
          iVar11 = -1;
          if (iVar6 != -1) {
            iVar7 = fio_set_non_block(iVar6);
            if (iVar7 != -1) {
              if ((char)uVar14 == '\0') {
                iVar7 = connect(iVar6,(sockaddr *)&pos,0x6e);
                if ((iVar7 != -1) || (*piVar9 == 0x73)) goto LAB_00106c83;
              }
              else {
                unlink((char *)((long)&pos + 2));
                iVar7 = bind(iVar6,(sockaddr *)&pos,0x6e);
                if ((iVar7 != -1) && (iVar7 = listen(iVar6,0x1000), -1 < iVar7)) {
                  fchmod(iVar6,0x1ff);
LAB_00106c83:
                  lVar15 = (long)iVar6 * 0xa8;
                  fio_lock((fio_lock_i *)((long)fio_data + lVar15 + 0x6c));
                  fio_clear_fd((long)iVar6,'\x01');
                  LOCK();
                  puVar1 = (undefined1 *)((long)fio_data + lVar15 + 0x6c);
                  addrinfo._0_1_ = *puVar1;
                  *puVar1 = 0;
                  pfVar5 = fio_data;
                  UNLOCK();
                  if (sVar10 < 0x30) {
                    local_b0 = (void *)((long)fio_data + lVar15 + 0x72);
                    memcpy(local_b0,local_b8,sVar10 + 1);
                    *(char *)((long)local_b0 + -1) = (char)sVar10;
                  }
                  iVar11 = (intptr_t)CONCAT41(iVar6,*(undefined1 *)((long)pfVar5 + lVar15 + 0x6d));
                  uVar14 = (ulong)local_bc;
                  goto LAB_00106d16;
                }
              }
            }
            close(iVar6);
            goto LAB_00106d13;
          }
        }
        else {
          if (1 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR("ERROR: (fio_unix_socket) address too long (%zu bytes > %zu bytes).",
                           sVar10,0x6b);
          }
          *piVar9 = 0x24;
LAB_00106d13:
          iVar11 = -1;
        }
LAB_00106d16:
        if (*piVar9 != 4) {
          return iVar11;
        }
      } while( true );
    }
    do {
      *piVar9 = 0;
      pos._4_4_ = 0;
      acStack_a0[4] = '\0';
      acStack_a0[5] = '\0';
      acStack_a0[6] = '\0';
      acStack_a0[7] = '\0';
      acStack_a0[8] = '\0';
      acStack_a0[9] = '\0';
      acStack_a0._10_6_ = 0;
      acStack_a0[0x10] = '\0';
      acStack_a0[0x11] = '\0';
      acStack_a0[0x12] = '\0';
      acStack_a0[0x13] = '\0';
      acStack_a0[0x14] = '\0';
      acStack_a0[0x15] = '\0';
      acStack_a0[0x16] = '\0';
      acStack_a0[0x17] = '\0';
      acStack_a0[0x18] = '\0';
      acStack_a0[0x19] = '\0';
      acStack_a0[0x1a] = '\0';
      acStack_a0[0x1b] = '\0';
      acStack_a0[0x1c] = '\0';
      acStack_a0[0x1d] = '\0';
      acStack_a0[0x1e] = '\0';
      acStack_a0[0x1f] = '\0';
      acStack_a0[0x20] = '\0';
      acStack_a0[0x21] = '\0';
      acStack_a0[0x22] = '\0';
      acStack_a0[0x23] = '\0';
      acStack_a0[0x24] = '\0';
      acStack_a0[0x25] = '\0';
      acStack_a0[0x26] = '\0';
      acStack_a0[0x27] = '\0';
      acStack_a0[0] = '\x01';
      acStack_a0[1] = '\0';
      acStack_a0[2] = '\0';
      acStack_a0[3] = '\0';
      pos._0_2_ = acStack_a0._0_2_;
      pos._2_2_ = acStack_a0._2_2_;
      iVar6 = getaddrinfo(address,pcVar13,(addrinfo *)&pos,(addrinfo **)&addrinfo);
      uStack_e0 = 0xffffffffffffffff;
      if (iVar6 == 0) {
        lVar15 = CONCAT71(addrinfo._1_7_,addrinfo._0_1_);
        fd = socket(*(int *)(lVar15 + 4),*(int *)(lVar15 + 8),*(int *)(lVar15 + 0xc));
        if ((int)fd < 1) {
          freeaddrinfo((addrinfo *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_));
        }
        else {
          iVar6 = fio_set_non_block(fd);
          if (-1 < iVar6) {
            if ((char)uVar14 == '\0') {
              optval = 1;
              setsockopt(fd,6,1,&optval,4);
              *piVar9 = 0;
              ppaVar12 = &addrinfo;
              do {
                paVar3 = *ppaVar12;
                if (paVar3 == (addrinfo *)0x0) {
                  freeaddrinfo((addrinfo *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_));
                  close(fd);
                  uStack_e0 = 0xffffffffffffffff;
                  address = local_b8;
                  goto LAB_00106b1f;
                }
                iVar6 = connect(fd,(sockaddr *)paVar3->ai_addr,paVar3->ai_addrlen);
              } while ((iVar6 != 0) && (ppaVar12 = &paVar3->ai_next, *piVar9 != 0x73));
LAB_00106aa4:
              lVar15 = (ulong)fd * 0xa8;
              fio_lock((fio_lock_i *)((long)fio_data + lVar15 + 0x6c));
              fio_clear_fd((ulong)fd,'\x01');
              LOCK();
              puVar1 = (undefined1 *)((long)fio_data + lVar15 + 0x6c);
              uVar2 = *puVar1;
              *puVar1 = 0;
              UNLOCK();
              optval = CONCAT31(optval._1_3_,uVar2);
              fio_tcp_addr_cpy(fd,*(int *)(((sockaddr *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_))->
                                           sa_data + 2),
                               (sockaddr *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_));
              freeaddrinfo((addrinfo *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_));
              uStack_e0 = (ulong)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar15 + 0x6d));
            }
            else {
              optval = 1;
              setsockopt(fd,1,2,&optval,4);
              bVar4 = false;
              ppaVar12 = &addrinfo;
              while (paVar3 = *ppaVar12, paVar3 != (addrinfo *)0x0) {
                iVar6 = bind(fd,(sockaddr *)paVar3->ai_addr,paVar3->ai_addrlen);
                if (iVar6 == 0) {
                  bVar4 = true;
                }
                ppaVar12 = &paVar3->ai_next;
              }
              if (bVar4) {
                optval = 0x80;
                setsockopt(fd,*(int *)(CONCAT71(addrinfo._1_7_,addrinfo._0_1_) + 0xc),0x17,&optval,4
                          );
                iVar6 = listen(fd,0x1000);
                if (-1 < iVar6) goto LAB_00106aa4;
              }
              freeaddrinfo((addrinfo *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_));
              close(fd);
              uStack_e0 = 0xffffffffffffffff;
            }
            uVar14 = (ulong)local_bc;
            address = local_b8;
            goto LAB_00106b1f;
          }
          freeaddrinfo((addrinfo *)CONCAT71(addrinfo._1_7_,addrinfo._0_1_));
          close(fd);
        }
        uStack_e0 = 0xffffffffffffffff;
        address = local_b8;
      }
LAB_00106b1f:
      if (*piVar9 != 4) {
        return uStack_e0;
      }
    } while( true );
  }
  if (1 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("ERROR: (fio_socket) both address and port are missing or invalid.");
  }
LAB_00106b59:
  piVar9 = __errno_location();
  *piVar9 = 0x16;
  return -1;
}

Assistant:

intptr_t fio_socket(const char *address, const char *port, uint8_t server) {
  intptr_t uuid;
  if (port) {
    char *pos = (char *)port;
    int64_t n = fio_atol(&pos);
    /* make sure port is only numerical */
    if (*pos) {
      FIO_LOG_ERROR("(fio_socket) port %s is not a number.", port);
      errno = EINVAL;
      return -1;
    }
    /* a negative port number will revert to a Unix socket. */
    if (n <= 0) {
      if (n < -1)
        FIO_LOG_WARNING("(fio_socket) negative port number %s is ignored.",
                        port);
      port = NULL;
    }
  }
  if (!address && !port) {
    FIO_LOG_ERROR("(fio_socket) both address and port are missing or invalid.");
    errno = EINVAL;
    return -1;
  }
  if (!port) {
    do {
      errno = 0;
      uuid = fio_unix_socket(address, server);
    } while (errno == EINTR);
  } else {
    do {
      errno = 0;
      uuid = fio_tcp_socket(address, port, server);
    } while (errno == EINTR);
  }
  return uuid;
}